

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O0

void __thiscall
pstore::basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits>::basic_rotating_log
          (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this,
          string *base_name,streamoff max_size,uint num_backups,fstream_traits *stream_traits,
          file_system_traits *fs_traits)

{
  long *plVar1;
  long local_40;
  file_system_traits *local_38;
  file_system_traits *fs_traits_local;
  fstream_traits *stream_traits_local;
  streamoff sStack_20;
  uint num_backups_local;
  streamoff max_size_local;
  string *base_name_local;
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this_local;
  
  local_38 = fs_traits;
  fs_traits_local = (file_system_traits *)stream_traits;
  stream_traits_local._4_4_ = num_backups;
  sStack_20 = max_size;
  max_size_local = (streamoff)base_name;
  base_name_local = (string *)this;
  basic_logger::basic_logger(&this->super_basic_logger);
  (this->super_basic_logger).super_logger._vptr_logger =
       (_func_int **)&PTR__basic_rotating_log_003d8988;
  local_40 = 0;
  plVar1 = std::max<long>(&stack0xffffffffffffffe0,&local_40);
  this->max_size_ = *plVar1;
  std::__cxx11::string::string((string *)&this->base_name_,(string *)base_name);
  this->num_backups_ = stream_traits_local._4_4_;
  std::ofstream::ofstream(&this->stream_);
  this->is_open_ = false;
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::basic_rotating_log (
        std::string base_name, std::streamoff const max_size, unsigned const num_backups,
        StreamTraits const & stream_traits, FileSystemTraits const & fs_traits)
            : max_size_ (std::max (max_size, std::streamoff{0}))
            , base_name_{std::move (base_name)}
            , num_backups_ (num_backups)
            , stream_ ()
            , stream_traits_ (stream_traits)
            , file_system_traits_ (fs_traits) {}